

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O1

void __thiscall Printer::Printer(Printer *this,DataAttrInfo *attributes_,int attrCount_)

{
  uint uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  DataAttrInfo *pDVar4;
  char **ppcVar5;
  int *piVar6;
  char *pcVar7;
  ulong uVar8;
  size_t sVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  
  this->attrCount = attrCount_;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)attrCount_;
  uVar8 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(0x44),8) == 0) {
    uVar8 = SUB168(auVar2 * ZEXT816(0x44),0);
  }
  pDVar4 = (DataAttrInfo *)operator_new__(uVar8);
  if (attrCount_ != 0) {
    lVar11 = 0;
    do {
      pcVar7 = pDVar4->attrName + lVar11 + 7;
      pcVar7[0] = '\0';
      pcVar7[1] = '\0';
      pcVar7[2] = '\0';
      pcVar7[3] = '\0';
      pcVar7[4] = '\0';
      pcVar7[5] = '\0';
      pcVar7[6] = '\0';
      pcVar7[7] = '\0';
      pcVar7[8] = '\0';
      pcVar7[9] = '\0';
      pcVar7[10] = '\0';
      pcVar7[0xb] = '\0';
      pcVar7[0xc] = '\0';
      pcVar7[0xd] = '\0';
      pcVar7[0xe] = '\0';
      pcVar7[0xf] = '\0';
      pcVar7 = pDVar4->relName + lVar11 + 0x10;
      pcVar7[0] = '\0';
      pcVar7[1] = '\0';
      pcVar7[2] = '\0';
      pcVar7[3] = '\0';
      pcVar7[4] = '\0';
      pcVar7[5] = '\0';
      pcVar7[6] = '\0';
      pcVar7[7] = '\0';
      pcVar7[8] = '\0';
      pcVar7[9] = '\0';
      pcVar7[10] = '\0';
      pcVar7[0xb] = '\0';
      pcVar7[0xc] = '\0';
      pcVar7[0xd] = '\0';
      pcVar7[0xe] = '\0';
      pcVar7[0xf] = '\0';
      pcVar7 = pDVar4->relName + lVar11;
      pcVar7[0] = '\0';
      pcVar7[1] = '\0';
      pcVar7[2] = '\0';
      pcVar7[3] = '\0';
      pcVar7[4] = '\0';
      pcVar7[5] = '\0';
      pcVar7[6] = '\0';
      pcVar7[7] = '\0';
      pcVar7[8] = '\0';
      pcVar7[9] = '\0';
      pcVar7[10] = '\0';
      pcVar7[0xb] = '\0';
      pcVar7[0xc] = '\0';
      pcVar7[0xd] = '\0';
      pcVar7[0xe] = '\0';
      pcVar7[0xf] = '\0';
      (pDVar4->attrName + lVar11 + 0x17)[0] = '\0';
      (pDVar4->attrName + lVar11 + 0x17)[1] = '\0';
      lVar11 = lVar11 + 0x44;
    } while ((long)attrCount_ * 0x44 != lVar11);
  }
  this->attributes = pDVar4;
  iVar10 = this->attrCount;
  if (0 < iVar10) {
    lVar12 = 0;
    lVar11 = 0;
    do {
      DataAttrInfo::operator=
                ((DataAttrInfo *)(this->attributes->relName + lVar12),
                 (DataAttrInfo *)(attributes_->relName + lVar12));
      lVar11 = lVar11 + 1;
      iVar10 = this->attrCount;
      lVar12 = lVar12 + 0x44;
    } while (lVar11 < iVar10);
  }
  this->iCount = 0;
  ppcVar5 = (char **)malloc((long)iVar10 * 8);
  this->psHeader = ppcVar5;
  uVar8 = 0xffffffffffffffff;
  if (-1 < iVar10) {
    uVar8 = (long)iVar10 * 4;
  }
  piVar6 = (int *)operator_new__(uVar8);
  this->spaces = piVar6;
  if (0 < this->attrCount) {
    lVar11 = 0;
    do {
      pcVar7 = (char *)operator_new__(0x35);
      this->psHeader[lVar11] = pcVar7;
      pcVar7 = this->psHeader[lVar11];
      pcVar7[0] = '\0';
      pcVar7[1] = '\0';
      pcVar7[2] = '\0';
      pcVar7[3] = '\0';
      pcVar7[4] = '\0';
      pcVar7[5] = '\0';
      pcVar7[6] = '\0';
      pcVar7[7] = '\0';
      pcVar7[8] = '\0';
      pcVar7[9] = '\0';
      pcVar7[10] = '\0';
      pcVar7[0xb] = '\0';
      pcVar7[0xc] = '\0';
      pcVar7[0xd] = '\0';
      pcVar7[0xe] = '\0';
      pcVar7[0xf] = '\0';
      pcVar7[0x20] = '\0';
      pcVar7[0x21] = '\0';
      pcVar7[0x22] = '\0';
      pcVar7[0x23] = '\0';
      pcVar7[0x24] = '\0';
      pcVar7[0x25] = '\0';
      pcVar7[0x26] = '\0';
      pcVar7[0x27] = '\0';
      pcVar7[0x28] = '\0';
      pcVar7[0x29] = '\0';
      pcVar7[0x2a] = '\0';
      pcVar7[0x2b] = '\0';
      pcVar7[0x2c] = '\0';
      pcVar7[0x2d] = '\0';
      pcVar7[0x2e] = '\0';
      pcVar7[0x2f] = '\0';
      pcVar7[0x10] = '\0';
      pcVar7[0x11] = '\0';
      pcVar7[0x12] = '\0';
      pcVar7[0x13] = '\0';
      pcVar7[0x14] = '\0';
      pcVar7[0x15] = '\0';
      pcVar7[0x16] = '\0';
      pcVar7[0x17] = '\0';
      pcVar7[0x18] = '\0';
      pcVar7[0x19] = '\0';
      pcVar7[0x1a] = '\0';
      pcVar7[0x1b] = '\0';
      pcVar7[0x1c] = '\0';
      pcVar7[0x1d] = '\0';
      pcVar7[0x1e] = '\0';
      pcVar7[0x1f] = '\0';
      pcVar7[0x2d] = '\0';
      pcVar7[0x2e] = '\0';
      pcVar7[0x2f] = '\0';
      pcVar7[0x30] = '\0';
      pcVar7[0x31] = '\0';
      pcVar7[0x32] = '\0';
      pcVar7[0x33] = '\0';
      pcVar7[0x34] = '\0';
      iVar10 = this->attrCount;
      if (0 < (long)iVar10) {
        pDVar4 = this->attributes;
        pcVar7 = pDVar4->attrName;
        lVar12 = 0;
        do {
          if ((lVar11 != lVar12) && (iVar3 = strcmp(pDVar4[lVar11].attrName,pcVar7), iVar3 == 0)) {
            sprintf(this->psHeader[lVar11],"%s.%s",pDVar4 + lVar11,pDVar4[lVar11].attrName);
            goto LAB_0010d7dd;
          }
          lVar12 = lVar12 + 1;
          pcVar7 = pcVar7 + 0x44;
        } while (iVar10 != lVar12);
      }
      strcpy(this->psHeader[lVar11],this->attributes[lVar11].attrName);
LAB_0010d7dd:
      if (this->attributes[lVar11].attrType == STRING) {
        uVar1 = this->attributes[lVar11].attrLength;
        uVar8 = (ulong)uVar1;
        if (0x34 < (int)uVar1) {
          uVar8 = 0x35;
        }
      }
      else {
        uVar8 = strlen(this->psHeader[lVar11]);
        if (uVar8 < 0xd) {
          uVar8 = 0xc;
        }
      }
      this->spaces[lVar11] = (int)uVar8;
      pcVar7 = this->psHeader[lVar11];
      sVar9 = strlen(pcVar7);
      piVar6 = this->spaces;
      iVar10 = piVar6[lVar11] - (int)sVar9;
      piVar6[lVar11] = iVar10;
      if (iVar10 < 1) {
        piVar6[lVar11] = 0;
        sVar9 = strlen(pcVar7);
        (pcVar7 + sVar9)[0] = ' ';
        (pcVar7 + sVar9)[1] = '\0';
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < this->attrCount);
  }
  return;
}

Assistant:

Printer::Printer(const DataAttrInfo *attributes_, const int attrCount_)
{
    attrCount = attrCount_;
    attributes = new DataAttrInfo[attrCount];

    for (int i=0; i < attrCount; i++)
        attributes[i] = attributes_[i];

    // Number of tuples printed
    iCount = 0;

    // Figure out what the header information will look like.  Normally,
    // we can just use the attribute name, but if that appears more than
    // once, then we should use "relation.attribute".

    // this line broke when using CC
    // changing to use malloc and free instead of new and delete
    // psHeader = (char **) new (char *)[attrCount];
    psHeader = (char**)malloc(attrCount * sizeof(char*));

    // Also figure out the number of spaces between each attribute
    spaces = new int[attrCount];

    for (int i=0; i < attrCount; i++ ) {
        // Try to find the attribute in another column
        int bFound = 0;
        psHeader[i] = new char[MAXPRINTSTRING];
        memset(psHeader[i],0,MAXPRINTSTRING);

        for (int j=0; j < attrCount; j++)
            if (j != i &&
                strcmp(attributes[i].attrName,
                       attributes[j].attrName) == 0) {
                bFound = 1;
                break;
            }

        if (bFound)
            sprintf(psHeader[i], "%s.%s",
                    attributes[i].relName, attributes[i].attrName);
        else
            strcpy(psHeader[i], attributes[i].attrName);

        if (attributes[i].attrType==STRING)
            spaces[i] = min(attributes[i].attrLength, MAXPRINTSTRING);
        else
            spaces[i] = max(12, strlen(psHeader[i]));

        // We must subtract out those characters that will be for the
        // header.
        spaces[i] -= strlen(psHeader[i]);

        // If there are negative (or zero) spaces, then insert a single
        // space.
        if (spaces[i] < 1) {
            // The psHeader will give us the space we need
            spaces[i] = 0;
            strcat(psHeader[i]," ");
        }
    }
}